

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  undefined1 **pi;
  ulong uVar10;
  char **ppcVar11;
  char *pcVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  undefined1 *local_70;
  undefined1 *local_68;
  int local_60;
  int local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = *pp;
  local_50 = *pp1;
  local_58 = *pp2;
  do {
    pcVar12 = local_50;
    ppcVar11 = &local_58;
    cVar1 = *local_50;
    if ((cVar1 == '\0') && (*local_58 == '\0')) goto LAB_001cdb5a;
    local_5c = -0x55555556;
    local_60 = -0x55555556;
    if (cVar1 == '\0') {
      local_5c = 0x7fffffff;
LAB_001cd8a8:
      pcVar9 = local_58;
      if (*local_58 == '\0') {
        local_60 = 0x7fffffff;
      }
      else if (*local_58 == '\x01') {
        iVar6 = (int)local_58[1];
        if (local_58[1] < '\0') {
          sqlite3Fts3GetVarint32(local_58 + 1,&local_60);
          iVar6 = local_60;
        }
        local_60 = iVar6;
        if (local_60 == 0) goto LAB_001cdadd;
      }
      else {
        local_60 = 0;
      }
      if (local_5c == local_60) {
        local_68 = (undefined1 *)0x0;
        local_70 = (undefined1 *)0x0;
        lVar8 = 0;
        if (local_5c != 0) {
          lVar8 = 1;
          uVar10 = (long)local_5c;
          do {
            lVar7 = lVar8;
            bVar4 = (byte)uVar10;
            local_48[lVar7] = bVar4 | 0x80;
            lVar8 = lVar7 + 1;
            bVar2 = 0x7f < uVar10;
            uVar10 = uVar10 >> 7;
          } while (bVar2);
          local_48[lVar7] = bVar4;
          *local_48 = '\x01';
          local_48 = local_48 + lVar8;
        }
        pcVar12 = pcVar12 + lVar8;
        pcVar9 = pcVar9 + lVar8;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = pcVar9;
        local_50 = pcVar12;
        iVar6 = sqlite3Fts3GetVarintU(pcVar12,(sqlite_uint64 *)&local_40);
        puVar5 = local_40;
        local_50 = pcVar12 + iVar6;
        local_68 = local_40;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        iVar6 = sqlite3Fts3GetVarintU(pcVar9,(sqlite_uint64 *)&local_40);
        local_58 = pcVar9 + iVar6;
        local_70 = local_40;
        bVar2 = (long)local_40 < 2;
        iVar6 = 3;
        if (!bVar2 && (long)puVar5 >= 2) {
          puVar14 = (undefined1 *)0x0;
          do {
            puVar13 = local_70;
            if ((long)local_68 < (long)local_70) {
              puVar13 = local_68;
            }
            lVar8 = 0;
            uVar10 = (long)puVar13 - (long)puVar14;
            do {
              lVar7 = lVar8;
              bVar4 = (byte)uVar10;
              local_48[lVar7] = bVar4 | 0x80;
              bVar3 = 0x7f < uVar10;
              lVar8 = lVar7 + 1;
              uVar10 = uVar10 >> 7;
            } while (bVar3);
            local_48[lVar7] = bVar4;
            local_48 = local_48 + lVar7 + 1;
            if (local_68 == local_70) {
              fts3ReadNextPos(&local_50,(sqlite3_int64 *)&local_68);
LAB_001cda5e:
              pi = &local_70;
              ppcVar11 = &local_58;
            }
            else {
              if ((long)local_70 <= (long)local_68) goto LAB_001cda5e;
              pi = &local_68;
              ppcVar11 = &local_50;
            }
            fts3ReadNextPos(ppcVar11,(sqlite3_int64 *)pi);
            puVar14 = puVar13 + -2;
          } while ((local_68 != (undefined1 *)0x7fffffffffffffff) ||
                  (local_70 != (undefined1 *)0x7fffffffffffffff));
          iVar6 = 0;
        }
        if (bVar2 || (long)puVar5 < 2) goto LAB_001cdb4d;
      }
      else {
        if (local_5c < local_60) {
          if (local_5c == 0) {
            lVar8 = 0;
          }
          else {
            lVar8 = 1;
            uVar10 = (long)local_5c;
            do {
              lVar7 = lVar8;
              bVar4 = (byte)uVar10;
              local_48[lVar7] = bVar4 | 0x80;
              lVar8 = lVar7 + 1;
              bVar2 = 0x7f < uVar10;
              uVar10 = uVar10 >> 7;
            } while (bVar2);
            local_48[lVar7] = bVar4;
            *local_48 = '\x01';
            local_48 = local_48 + lVar8;
          }
          local_50 = pcVar12 + lVar8;
          ppcVar11 = &local_50;
        }
        else {
          if (local_60 == 0) {
            lVar8 = 0;
          }
          else {
            lVar8 = 1;
            uVar10 = (long)local_60;
            do {
              lVar7 = lVar8;
              bVar4 = (byte)uVar10;
              local_48[lVar7] = bVar4 | 0x80;
              lVar8 = lVar7 + 1;
              bVar2 = 0x7f < uVar10;
              uVar10 = uVar10 >> 7;
            } while (bVar2);
            local_48[lVar7] = bVar4;
            *local_48 = '\x01';
            local_48 = local_48 + lVar8;
          }
          local_58 = pcVar9 + lVar8;
        }
        fts3ColumnlistCopy(&local_48,ppcVar11);
      }
      iVar6 = 0;
    }
    else {
      if (cVar1 != '\x01') {
        local_5c = 0;
        goto LAB_001cd8a8;
      }
      iVar6 = (int)local_50[1];
      if (local_50[1] < '\0') {
        sqlite3Fts3GetVarint32(local_50 + 1,&local_5c);
        iVar6 = local_5c;
      }
      local_5c = iVar6;
      if (local_5c != 0) goto LAB_001cd8a8;
LAB_001cdadd:
      iVar6 = 1;
    }
LAB_001cdb4d:
  } while (iVar6 == 0);
  if (iVar6 == 3) {
LAB_001cdb5a:
    *local_48 = '\0';
    *pp = local_48 + 1;
    *pp1 = local_50 + 1;
    *pp2 = local_58 + 1;
    iVar6 = 0;
    local_48 = local_48 + 1;
  }
  else {
    iVar6 = 0x10b;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ){
      fts3GetVarint32(&p1[1], &iCol1);
      if( iCol1==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p1==POS_END ) iCol1 = 0x7fffffff;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ){
      fts3GetVarint32(&p2[1], &iCol2);
      if( iCol2==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p2==POS_END ) iCol2 = 0x7fffffff;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      if( i1<2 || i2<2 ){
        break;
      }
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2);
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
  return SQLITE_OK;
}